

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprogressdialog.cpp
# Opt level: O1

void QProgressDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  QProgressDialogPrivate *this;
  int *piVar2;
  QString *pQVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  undefined1 uVar7;
  int iVar8;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      QMetaObject::activate(_o,&staticMetaObject,0,(void **)0x0);
      break;
    case 1:
      lVar1 = *(long *)(_o + 8);
      *(undefined1 *)(lVar1 + 0x34c) = 1;
      reset((QProgressDialog *)_o);
      *(undefined2 *)(lVar1 + 0x34c) = 0x100;
      break;
    case 2:
      reset((QProgressDialog *)_o);
      break;
    case 3:
      QProgressBar::setMaximum(*(QProgressBar **)(*(long *)(_o + 8) + 0x2f0),*_a[1]);
      break;
    case 4:
      QProgressBar::setMinimum(*(QProgressBar **)(*(long *)(_o + 8) + 0x2f0),*_a[1]);
      break;
    case 5:
      QProgressBar::setRange(*(QProgressBar **)(*(long *)(_o + 8) + 0x2f0),*_a[1],*_a[2]);
      break;
    case 6:
      setValue((QProgressDialog *)_o,*_a[1]);
      break;
    case 7:
      setLabelText((QProgressDialog *)_o,(QString *)_a[1]);
      break;
    case 8:
      pQVar3 = (QString *)_a[1];
      this = *(QProgressDialogPrivate **)(_o + 8);
      this->useDefaultCancelText = false;
      QProgressDialogPrivate::setCancelButtonText(this,pQVar3);
      break;
    case 9:
      setMinimumDuration((QProgressDialog *)_o,*_a[1]);
      break;
    case 10:
      forceShow((QProgressDialog *)_o);
      break;
    case 0xb:
      QProgressDialogPrivate::_q_disconnectOnClose(*(QProgressDialogPrivate **)(_o + 8));
    }
    if (_c == ReadProperty) goto switchD_00512370_caseD_1;
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_00512370_caseD_3;
      goto switchD_00512370_caseD_5;
    }
    break;
  case ReadProperty:
switchD_00512370_caseD_1:
    if (7 < (uint)_id) goto LAB_00512582;
    piVar2 = (int *)*_a;
    switch(_id) {
    case 0:
      uVar7 = *(undefined1 *)(*(long *)(_o + 8) + 0x34d);
      goto LAB_0051256e;
    case 1:
      iVar8 = QProgressBar::minimum(*(QProgressBar **)(*(long *)(_o + 8) + 0x2f0));
      break;
    case 2:
      iVar8 = QProgressBar::maximum(*(QProgressBar **)(*(long *)(_o + 8) + 0x2f0));
      break;
    case 3:
      iVar8 = QProgressBar::value(*(QProgressBar **)(*(long *)(_o + 8) + 0x2f0));
      break;
    case 4:
      uVar7 = *(undefined1 *)(*(long *)(_o + 8) + 0x34b);
      goto LAB_0051256e;
    case 5:
      uVar7 = *(undefined1 *)(*(long *)(_o + 8) + 0x34a);
LAB_0051256e:
      *(undefined1 *)piVar2 = uVar7;
      goto LAB_00512582;
    case 6:
      iVar8 = *(int *)(*(long *)(_o + 8) + 0x340);
      break;
    case 7:
      if (*(QLabel **)(*(long *)(_o + 8) + 0x2e0) == (QLabel *)0x0) {
        local_48.d.d = (Data *)0x0;
        local_48.d.ptr = (char16_t *)0x0;
        local_48.d.size = 0;
      }
      else {
        QLabel::text(&local_48,*(QLabel **)(*(long *)(_o + 8) + 0x2e0));
      }
      pQVar4 = *(QArrayData **)piVar2;
      *(Data **)piVar2 = local_48.d.d;
      pcVar5 = *(char16_t **)(piVar2 + 2);
      *(char16_t **)(piVar2 + 2) = local_48.d.ptr;
      qVar6 = *(qsizetype *)(piVar2 + 4);
      *(qsizetype *)(piVar2 + 4) = local_48.d.size;
      local_48.d.d = (Data *)pQVar4;
      local_48.d.ptr = pcVar5;
      local_48.d.size = qVar6;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      goto LAB_00512582;
    }
    *piVar2 = iVar8;
LAB_00512582:
    if (_c != WriteProperty) goto switchD_00512370_caseD_3;
    break;
  case WriteProperty:
    break;
  default:
    goto switchD_00512370_caseD_3;
  case IndexOfMethod:
switchD_00512370_caseD_5:
    if ((*_a[1] == canceled) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_00512370_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_00512370_caseD_3;
      goto switchD_00512370_caseD_1;
    }
  }
  if (_id - 1U < 7) {
    pQVar3 = (QString *)*_a;
    switch(_id) {
    case 1:
      QProgressBar::setMinimum(*(QProgressBar **)(*(long *)(_o + 8) + 0x2f0),*(int *)&(pQVar3->d).d)
      ;
      break;
    case 2:
      QProgressBar::setMaximum(*(QProgressBar **)(*(long *)(_o + 8) + 0x2f0),*(int *)&(pQVar3->d).d)
      ;
      break;
    case 3:
      setValue((QProgressDialog *)_o,*(int *)&(pQVar3->d).d);
      break;
    case 4:
      *(undefined1 *)(*(long *)(_o + 8) + 0x34b) = *(undefined1 *)&(pQVar3->d).d;
      break;
    case 5:
      *(undefined1 *)(*(long *)(_o + 8) + 0x34a) = *(undefined1 *)&(pQVar3->d).d;
      break;
    case 6:
      setMinimumDuration((QProgressDialog *)_o,*(int *)&(pQVar3->d).d);
      break;
    case 7:
      setLabelText((QProgressDialog *)_o,pQVar3);
    }
  }
switchD_00512370_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QProgressDialog *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->canceled(); break;
        case 1: _t->cancel(); break;
        case 2: _t->reset(); break;
        case 3: _t->setMaximum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->setMinimum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setRange((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 6: _t->setValue((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->setLabelText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->setCancelButtonText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->setMinimumDuration((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 10: _t->forceShow(); break;
        case 11: _t->d_func()->_q_disconnectOnClose(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QProgressDialog::*)()>(_a, &QProgressDialog::canceled, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->wasCanceled(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->minimum(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->maximum(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->value(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->autoReset(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->autoClose(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->minimumDuration(); break;
        case 7: *reinterpret_cast<QString*>(_v) = _t->labelText(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setMinimum(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setMaximum(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setValue(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setAutoReset(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setAutoClose(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setMinimumDuration(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setLabelText(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
}